

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void int_tif_to_float<int>
               (uint32_t width,uint32_t height,uint16_t spp,uint16_t config,TIFF *tif,
               vector<float,_std::allocator<float>_> *output_buffer)

{
  pointer pfVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  runtime_error *this;
  uint uVar5;
  uint32_t uVar6;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint32_t y;
  uint32_t uVar12;
  bool bVar13;
  
  uVar3 = TIFFScanlineSize(tif);
  lVar4 = _TIFFmalloc(uVar3);
  uVar9 = (uint)CONCAT62(in_register_00000012,spp);
  std::vector<float,_std::allocator<float>_>::resize(output_buffer,(ulong)(height * width * uVar9));
  iVar8 = (int)CONCAT62(in_register_0000000a,config);
  if (iVar8 == 1) {
    uVar2 = 0;
    for (uVar12 = 0; uVar12 != height; uVar12 = uVar12 + 1) {
      uVar7 = 0;
      TIFFReadScanline(tif,lVar4);
      uVar11 = uVar2;
      for (uVar6 = 0; uVar6 != width; uVar6 = uVar6 + 1) {
        pfVar1 = (output_buffer->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar8 = (int)uVar7;
        uVar10 = (ulong)spp;
        uVar5 = uVar11;
        while( true ) {
          bVar13 = uVar10 == 0;
          uVar10 = uVar10 - 1;
          if (bVar13) break;
          pfVar1[uVar5] = (float)*(int *)(lVar4 + uVar7 * 4) * 4.656613e-10;
          uVar5 = uVar5 + 1;
          uVar7 = (ulong)((int)uVar7 + 1);
        }
        uVar11 = uVar11 + uVar9;
        uVar7 = (ulong)(iVar8 + uVar9);
      }
      uVar2 = uVar2 + width * uVar9;
    }
  }
  else {
    if (iVar8 != 2) {
      _TIFFfree(lVar4);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Invalid planar config");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (uVar2 = 0; uVar2 != uVar9; uVar2 = uVar2 + 1) {
      uVar11 = uVar2;
      for (uVar12 = 0; uVar12 != height; uVar12 = uVar12 + 1) {
        TIFFReadScanline(tif,lVar4,uVar12,(short)uVar2);
        pfVar1 = (output_buffer->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = uVar11;
        for (uVar7 = 0; width != uVar7; uVar7 = uVar7 + 1) {
          pfVar1[uVar5] = (float)*(int *)(lVar4 + uVar7 * 4) * 4.656613e-10;
          uVar5 = uVar5 + uVar9;
        }
        uVar11 = uVar11 + width * uVar9;
      }
    }
  }
  _TIFFfree(lVar4);
  return;
}

Assistant:

void int_tif_to_float(
    uint32_t width, uint32_t height,
    uint16_t spp,
    uint16_t config,
    TIFF* tif,
    std::vector<float>& output_buffer)
{
    tdata_t buf;
    buf = _TIFFmalloc(TIFFScanlineSize(tif));

    output_buffer.resize(width * height * spp);

    switch (config) {
        case PLANARCONFIG_CONTIG:
            for (uint32_t y = 0; y < height; y++) {
                TIFFReadScanline(tif, buf, y, 0);
                T* scanline = (T*)buf;

                for (uint32_t x = 0; x < width; x++) {
                    for (uint16_t c = 0;  c < spp; c++) {
                        output_buffer[spp * (y * width + x) + c] = (float)scanline[spp * x + c] / (float)std::numeric_limits<T>::max();
                    }
                }
            }
            break;

        // TODO: This is untested code!
        case PLANARCONFIG_SEPARATE:
            for (uint16_t c = 0;  c < spp; c++) {
                for (uint32_t y = 0; y < height; y++) {
                    TIFFReadScanline(tif, buf, y, c);
                    T* scanline = (T*)buf;

                    for (uint32_t x = 0; x < width; x++) {
                        output_buffer[spp * (y * width + x) + c] = (float)scanline[x] / (float)std::numeric_limits<T>::max();
                    }
                }
            }
            break;

        default:
            _TIFFfree(buf);
            throw std::runtime_error("Invalid planar config");
    }

    _TIFFfree(buf);
}